

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

bool __thiscall
interpreter::Interpreter::checkEvalErrors
          (Interpreter *this,
          list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *eval_src)

{
  bool bVar1;
  int iVar2;
  reference ob;
  Object *pOVar3;
  ErrorObject *pEVar4;
  ostream *this_00;
  string local_78 [32];
  GCPtr<symbols::ErrorObject> local_58;
  GCPtr<symbols::ErrorObject> err;
  GCPtr<symbols::Object> local_40;
  GCPtr<symbols::Object> eval;
  iterator __end1;
  iterator __begin1;
  list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *__range1;
  bool hasErrors;
  list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *eval_src_local;
  Interpreter *this_local;
  
  __range1._7_1_ = false;
  __end1 = std::__cxx11::list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::
           begin(eval_src);
  eval.addr = (Object *)
              std::__cxx11::list<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>::
              end(eval_src);
  while( true ) {
    bVar1 = std::operator==(&__end1,(_Self *)&eval);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ob = std::_List_iterator<GCPtr<symbols::Object>_>::operator*(&__end1);
    GCPtr<symbols::Object>::GCPtr(&local_40,ob);
    pOVar3 = GCPtr<symbols::Object>::operator->(&local_40);
    iVar2 = (**pOVar3->_vptr_Object)();
    if (iVar2 == 4) {
      pEVar4 = (ErrorObject *)GCPtr<symbols::Object>::raw(&local_40);
      GCPtr<symbols::ErrorObject>::GCPtr(&local_58,pEVar4);
      pEVar4 = GCPtr<symbols::ErrorObject>::operator->(&local_58);
      (*(pEVar4->super_Object)._vptr_Object[3])(local_78);
      this_00 = std::operator<<((ostream *)&std::cout,local_78);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string(local_78);
      __range1._7_1_ = true;
      GCPtr<symbols::ErrorObject>::~GCPtr(&local_58);
    }
    GCPtr<symbols::Object>::~GCPtr(&local_40);
    std::_List_iterator<GCPtr<symbols::Object>_>::operator++(&__end1);
  }
  return __range1._7_1_;
}

Assistant:

bool  interpreter::Interpreter::checkEvalErrors(list<GCPtr<Object>> eval_src)
{
    bool hasErrors = false;
    for(auto eval : eval_src){
        if(eval->type() == Types::ERRORTYPE){
            GCPtr<ErrorObject> err = static_cast<ErrorObject*>(eval.raw());
            cout << err->toString() << endl;
            hasErrors = true;
        }
    }
    return hasErrors;
}